

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O0

lu_int basiclu_obj_update(basiclu_object *obj,double xtbl)

{
  lu_int lVar1;
  basiclu_object *in_RDI;
  lu_int status;
  double in_stack_00000298;
  double *in_stack_000002a0;
  lu_int *in_stack_000002a8;
  double *in_stack_000002b0;
  lu_int *in_stack_000002b8;
  double *in_stack_000002c0;
  lu_int *in_stack_000002c8;
  lu_int *in_stack_000002e0;
  double *in_stack_000002e8;
  int local_1c;
  lu_int local_4;
  
  local_1c = 0;
  lVar1 = isvalid(in_RDI);
  if (lVar1 == 0) {
    local_4 = -8;
  }
  else {
    while ((local_1c == 0 &&
           (local_1c = basiclu_update(in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
                                      in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,
                                      in_stack_000002e0,in_stack_000002e8,in_stack_00000298),
           local_1c == 1))) {
      local_1c = lu_realloc_obj(in_RDI);
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

lu_int basiclu_obj_update(struct basiclu_object *obj, double xtbl)
{
    lu_int status = BASICLU_OK;

    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    while (status == BASICLU_OK)
    {
        status = basiclu_update(obj->istore, obj->xstore, obj->Li, obj->Lx,
                                obj->Ui, obj->Ux, obj->Wi, obj->Wx, xtbl);
        if (status != BASICLU_REALLOCATE)
            break;
        status = lu_realloc_obj(obj);
    }

    return status;
}